

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
::SearchFrom(iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
             *this,size_type start_bucket)

{
  bool bVar1;
  LogMessage *pLVar2;
  reference ppMVar3;
  Node *pNVar4;
  _Rb_tree_const_iterator<google::protobuf::MapKey_*> local_b8;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  *local_70;
  Tree *tree;
  byte local_51;
  LogMessage local_50;
  size_type local_18;
  size_type start_bucket_local;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *this_local;
  
  local_51 = 0;
  local_18 = start_bucket;
  start_bucket_local = (size_type)this;
  if ((this->m_->index_of_first_non_null_ != this->m_->num_buckets_) &&
     (this->m_->table_[this->m_->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
               ,0x191);
    local_51 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: m_->index_of_first_non_null_ == m_->num_buckets_ || m_->table_[m_->index_of_first_non_null_] != NULL: "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),pLVar2);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  this->node_ = (Node *)0x0;
  this->bucket_index_ = local_18;
  while( true ) {
    if (this->m_->num_buckets_ <= this->bucket_index_) {
      return;
    }
    bVar1 = TableEntryIsNonEmptyList(this->m_,this->bucket_index_);
    if (bVar1) break;
    bVar1 = TableEntryIsTree(this->m_,this->bucket_index_);
    if (bVar1) {
      local_70 = (set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                  *)this->m_->table_[this->bucket_index_];
      bVar1 = std::
              set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
              ::empty(local_70);
      local_a9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                   ,0x19a);
        local_a9 = 1;
        pLVar2 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: !tree->empty(): ");
        internal::LogFinisher::operator=(&local_aa,pLVar2);
      }
      if ((local_a9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_a8);
      }
      local_b8._M_node =
           (_Base_ptr)
           std::
           set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
           ::begin(local_70);
      ppMVar3 = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*(&local_b8);
      pNVar4 = NodePtrFromKeyPtr(*ppMVar3);
      this->node_ = pNVar4;
      return;
    }
    this->bucket_index_ = this->bucket_index_ + 1;
  }
  this->node_ = (Node *)this->m_->table_[this->bucket_index_];
  return;
}

Assistant:

void SearchFrom(size_type start_bucket) {
        GOOGLE_DCHECK(m_->index_of_first_non_null_ == m_->num_buckets_ ||
               m_->table_[m_->index_of_first_non_null_] != NULL);
        node_ = NULL;
        for (bucket_index_ = start_bucket; bucket_index_ < m_->num_buckets_;
             bucket_index_++) {
          if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
            node_ = static_cast<Node*>(m_->table_[bucket_index_]);
            break;
          } else if (m_->TableEntryIsTree(bucket_index_)) {
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            GOOGLE_DCHECK(!tree->empty());
            node_ = NodePtrFromKeyPtr(*tree->begin());
            break;
          }
        }
      }